

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_float.h
# Opt level: O2

adjusted_mantissa
duckdb_fast_float::parse_long_mantissa<duckdb_fast_float::binary_format<double>>
          (char *first,char *last)

{
  bool bVar1;
  int iVar2;
  byte *pbVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  byte *pbVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  adjusted_mantissa aVar12;
  decimal answer;
  decimal local_330;
  
  local_330.negative = *first == '-';
  local_330.truncated = false;
  for (pbVar7 = (byte *)(first + local_330.negative);
      (pbVar3 = (byte *)last, pbVar7 != (byte *)last && (pbVar3 = pbVar7, *pbVar7 == 0x30));
      pbVar7 = pbVar7 + 1) {
  }
  iVar10 = (int)pbVar3;
  local_330._0_8_ = 0;
LAB_01659daf:
  uVar6 = (uint)local_330._0_8_;
  if (pbVar3 != (byte *)last) {
    bVar5 = *pbVar3 - 0x30;
    if (bVar5 < 10) goto code_r0x01659dc0;
    if (*pbVar3 == 0x2e) {
      pbVar7 = pbVar3 + 1;
      pbVar3 = pbVar7;
      if (uVar6 == 0) {
        for (; (pbVar3 = (byte *)last, pbVar7 != (byte *)last && (pbVar3 = pbVar7, *pbVar7 == 0x30))
            ; pbVar7 = pbVar7 + 1) {
        }
      }
      uVar4 = (ulong)pbVar3 & 0xffffffff;
      while( true ) {
        if (((last < pbVar3 + 8) || (uVar8 = (int)local_330._0_8_ + 8, 0x2ff < uVar8)) ||
           (uVar11 = *(long *)pbVar3 + 0xcfcfcfcfcfcfcfd0,
           ((*(long *)pbVar3 + 0x4646464646464646U | uVar11) & 0x8080808080808080) != 0)) break;
        *(ulong *)(local_330.digits + local_330._0_8_) = uVar11;
        uVar4 = (ulong)((int)uVar4 + 8);
        local_330._0_8_ = ZEXT48(uVar8);
        pbVar3 = pbVar3 + 8;
      }
      iVar10 = (iVar10 + 1 + uVar6) - (int)uVar4;
      for (; (uVar6 = (uint)local_330._0_8_, pbVar3 != (byte *)last && ((byte)(*pbVar3 - 0x30) < 10)
             ); pbVar3 = pbVar3 + 1) {
        if (uVar6 < 0x300) {
          local_330.digits[local_330._0_8_] = *pbVar3 - 0x30;
        }
        local_330._0_8_ = ZEXT48(uVar6 + 1);
        iVar10 = iVar10 + -1;
      }
      local_330.decimal_point = iVar10;
      local_330.num_digits = uVar6;
      goto LAB_01659e9b;
    }
  }
  iVar10 = 0;
LAB_01659e9b:
  if (uVar6 == 0) {
    uVar6 = 0;
  }
  else {
    iVar9 = 0;
    pbVar7 = pbVar3;
    while( true ) {
      pbVar7 = pbVar7 + -1;
      bVar5 = *pbVar7;
      if ((bVar5 != 0x30) && (bVar5 != 0x2e)) break;
      iVar9 = iVar9 + (uint)(bVar5 == 0x30);
    }
    iVar10 = iVar10 + uVar6;
    uVar6 = uVar6 - iVar9;
    local_330.decimal_point = iVar10;
    local_330.num_digits = uVar6;
    if (0x300 < uVar6) {
      local_330.truncated = true;
      local_330.num_digits = 0x300;
      uVar6 = 0x300;
    }
  }
  if ((pbVar3 == (byte *)last) || ((*pbVar3 | 0x20) != 0x65)) goto LAB_01659f63;
  pbVar7 = pbVar3 + 1;
  iVar9 = 0;
  if (pbVar7 == (byte *)last) {
LAB_01659f2a:
    pbVar3 = pbVar7;
    bVar1 = false;
  }
  else {
    pbVar3 = pbVar3 + 2;
    if (*pbVar7 != 0x2d) {
      if (*pbVar7 == 0x2b) {
        pbVar7 = pbVar3;
      }
      goto LAB_01659f2a;
    }
    bVar1 = true;
  }
  for (; (pbVar3 != (byte *)last && ((byte)(*pbVar3 - 0x30) < 10)); pbVar3 = pbVar3 + 1) {
    if (iVar9 < 0x10000) {
      iVar9 = (uint)(byte)(*pbVar3 - 0x30) + iVar9 * 10;
    }
  }
  iVar2 = -iVar9;
  if (!bVar1) {
    iVar2 = iVar9;
  }
  local_330.decimal_point = iVar10 + iVar2;
LAB_01659f63:
  for (uVar4 = (ulong)uVar6; uVar4 < 0x13; uVar4 = uVar4 + 1) {
    local_330.digits[uVar4] = '\0';
  }
  aVar12 = compute_float<duckdb_fast_float::binary_format<double>>(&local_330);
  return aVar12;
code_r0x01659dc0:
  if (uVar6 < 0x300) {
    local_330.digits[local_330._0_8_] = bVar5;
  }
  local_330._0_8_ = ZEXT48(uVar6 + 1);
  pbVar3 = pbVar3 + 1;
  goto LAB_01659daf;
}

Assistant:

fastfloat_really_inline decimal parse_decimal(const char *p, const char *pend, const char decimal_separator = '.') noexcept {
  decimal answer;
  answer.num_digits = 0;
  answer.decimal_point = 0;
  answer.truncated = false;
  answer.negative = (*p == '-');
  if (*p == '-') { // C++17 20.19.3.(7.1) explicitly forbids '+' sign here
    ++p;
  }
  // skip leading zeroes
  while ((p != pend) && (*p == '0')) {
    ++p;
  }
  while ((p != pend) && is_integer(*p)) {
    if (answer.num_digits < max_digits) {
      answer.digits[answer.num_digits] = uint8_t(*p - '0');
    }
    answer.num_digits++;
    ++p;
  }
  if ((p != pend) && (*p == decimal_separator)) {
    ++p;
    const char *first_after_period = p;
    // if we have not yet encountered a zero, we have to skip it as well
    if(answer.num_digits == 0) {
      // skip zeros
      while ((p != pend) && (*p == '0')) {
       ++p;
      }
    }
    // We expect that this loop will often take the bulk of the running time
    // because when a value has lots of digits, these digits often
    while ((p + 8 <= pend) && (answer.num_digits + 8 < max_digits)) {
      uint64_t val = read_u64(p);
      if(! is_made_of_eight_digits_fast(val)) { break; }
      // We have eight digits, process them in one go!
      val -= 0x3030303030303030;
      write_u64(answer.digits + answer.num_digits, val);
      answer.num_digits += 8;
      p += 8;
    }
    while ((p != pend) && is_integer(*p)) {
      if (answer.num_digits < max_digits) {
        answer.digits[answer.num_digits] = uint8_t(*p - '0');
      }
      answer.num_digits++;
      ++p;
    }
    answer.decimal_point = int32_t(first_after_period - p);
  }
  // We want num_digits to be the number of significant digits, excluding
  // leading *and* trailing zeros! Otherwise the truncated flag later is
  // going to be misleading.
  if(answer.num_digits > 0) {
    // We potentially need the answer.num_digits > 0 guard because we
    // prune leading zeros. So with answer.num_digits > 0, we know that
    // we have at least one non-zero digit.
    const char *preverse = p - 1;
    int32_t trailing_zeros = 0;
    while ((*preverse == '0') || (*preverse == decimal_separator)) {
      if(*preverse == '0') { trailing_zeros++; };
      --preverse;
    }
    answer.decimal_point += int32_t(answer.num_digits);
    answer.num_digits -= uint32_t(trailing_zeros);
  }
  if(answer.num_digits > max_digits) {
    answer.truncated = true;
    answer.num_digits = max_digits;
  }
  if ((p != pend) && (('e' == *p) || ('E' == *p))) {
    ++p;
    bool neg_exp = false;
    if ((p != pend) && ('-' == *p)) {
      neg_exp = true;
      ++p;
    } else if ((p != pend) && ('+' == *p)) { // '+' on exponent is allowed by C++17 20.19.3.(7.1)
      ++p;
    }
    int32_t exp_number = 0; // exponential part
    while ((p != pend) && is_integer(*p)) {
      uint8_t digit = uint8_t(*p - '0');
      if (exp_number < 0x10000) {
        exp_number = 10 * exp_number + digit;
      }
      ++p;
    }
    answer.decimal_point += (neg_exp ? -exp_number : exp_number);
  }
  // In very rare cases, we may have fewer than 19 digits, we want to be able to reliably
  // assume that all digits up to max_digit_without_overflow have been initialized.
  for(uint32_t i = answer.num_digits; i < max_digit_without_overflow; i++) { answer.digits[i] = 0; }

  return answer;
}